

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_bson.hpp
# Opt level: O0

type jsoncons::bson::encode_bson<(anonymous_namespace)::ns::Person>
               (Person *val,ostream *os,bson_encode_options *options)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  basic_json_visitor<char> *in_RDI;
  error_code ec;
  bson_stream_encoder encoder;
  error_code *in_stack_fffffffffffffe98;
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_fffffffffffffea0
  ;
  binary_stream_sink *in_stack_fffffffffffffea8;
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this;
  ser_error *this_00;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffec8;
  binary_stream_sink *in_stack_fffffffffffffed0;
  error_code local_110 [2];
  undefined1 local_e9 [225];
  basic_json_visitor<char> *local_8;
  
  this = (basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)(local_e9 + 1);
  local_8 = in_RDI;
  binary_stream_sink::binary_stream_sink(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  this_00 = (ser_error *)local_e9;
  std::allocator<char>::allocator();
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::basic_bson_encoder
            (this,in_stack_fffffffffffffea8,(bson_encode_options *)in_stack_fffffffffffffea0,
             (allocator<char> *)in_stack_fffffffffffffe98);
  std::allocator<char>::~allocator((allocator<char> *)local_e9);
  binary_stream_sink::~binary_stream_sink((binary_stream_sink *)this);
  std::error_code::error_code((error_code *)in_stack_fffffffffffffea0);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             in_stack_fffffffffffffea0);
  encode_traits<(anonymous_namespace)::ns::Person,char,void>::
  encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            ((Person *)this,local_8,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x2870d5);
  bVar1 = std::error_code::operator_cast_to_bool(local_110);
  if (!bVar1) {
    basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::~basic_bson_encoder
              (in_stack_fffffffffffffea0);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  ec_00._M_cat = local_110[0]._M_cat;
  ec_00._M_value = local_110[0]._M_value;
  ec_00._4_4_ = local_110[0]._4_4_;
  ser_error::ser_error(this_00,ec_00);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

typename std::enable_if<!ext_traits::is_basic_json<T>::value,void>::type 
    encode_bson(const T& val, 
                std::ostream& os, 
                const bson_encode_options& options = bson_encode_options())
    {
        bson_stream_encoder encoder(os, options);
        std::error_code ec;
        encode_traits<T,char>::encode(val, encoder, json(), ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec));
        }
    }